

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O1

void Imf_3_4::saveFlatScanLineImage
               (string *fileName,Header *hdr,FlatImage *img,DataWindowSource dws)

{
  char *pcVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  const_iterator cVar6;
  ConstIterator CVar7;
  string *psVar8;
  undefined1 auVar9 [16];
  OutputFile out;
  Header newHdr;
  FrameBuffer fb;
  FrameBuffer local_d0;
  Header local_98 [56];
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  local_60;
  
  local_d0._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,local_98,0x40,0x40,&local_d0,0,3);
  p_Var3 = (_Rb_tree_node_base *)Imf_3_4::Header::begin();
  while( true ) {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_4::Header::end();
    if (p_Var3 == p_Var4) break;
    p_Var4 = p_Var3 + 1;
    iVar2 = strcmp((char *)p_Var4,"dataWindow");
    if (iVar2 != 0) {
      iVar2 = strcmp((char *)p_Var4,"tiles");
      if (iVar2 != 0) {
        iVar2 = strcmp((char *)p_Var4,"channels");
        if (iVar2 != 0) {
          Imf_3_4::Header::insert((char *)local_98,(Attribute *)p_Var4);
        }
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  dataWindowForFile((Imf_3_4 *)&local_d0,hdr,&img->super_Image,dws);
  puVar5 = (undefined8 *)Imf_3_4::Header::dataWindow();
  *puVar5 = local_d0._map._M_t._M_impl._0_8_;
  puVar5[1] = CONCAT44(local_d0._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                       local_d0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  iVar2 = (*(img->super_Image)._vptr_Image[4])(img,0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar6._M_node = (_Base_ptr)FlatImageLevel::begin((FlatImageLevel *)CONCAT44(extraout_var,iVar2));
  while( true ) {
    CVar7 = FlatImageLevel::end((FlatImageLevel *)CONCAT44(extraout_var,iVar2));
    if ((const_iterator)cVar6._M_node == CVar7._i._M_node) break;
    psVar8 = (string *)Imf_3_4::Header::channels();
    auVar9 = ImageChannel::channel(*(ImageChannel **)(cVar6._M_node + 2));
    local_d0._map._M_t._M_impl._0_8_ = auVar9._0_8_;
    local_d0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = auVar9._8_4_;
    local_d0._map._M_t._M_impl.super__Rb_tree_header._M_header._4_1_ = auVar9[0xc];
    Imf_3_4::ChannelList::insert(psVar8,(Channel *)(cVar6._M_node + 1));
    (**(code **)(**(long **)(cVar6._M_node + 2) + 0x20))(&local_d0);
    Imf_3_4::FrameBuffer::insert((string *)&local_60,(Slice *)(cVar6._M_node + 1));
    cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
  }
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)&local_d0,pcVar1,local_98,iVar2);
  Imf_3_4::OutputFile::setFrameBuffer(&local_d0);
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::OutputFile::writePixels((int)&local_d0);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&local_d0);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree(&local_60);
  Imf_3_4::Header::~Header(local_98);
  return;
}

Assistant:

void
saveFlatScanLineImage (
    const string&    fileName,
    const Header&    hdr,
    const FlatImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    const FlatImageLevel& level = img.level ();
    FrameBuffer           fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
    {
        newHdr.channels ().insert (i.name (), i.channel ().channel ());
        fb.insert (i.name (), i.channel ().slice ());
    }

    OutputFile out (fileName.c_str (), newHdr);
    out.setFrameBuffer (fb);
    out.writePixels (
        newHdr.dataWindow ().max.y - newHdr.dataWindow ().min.y + 1);
}